

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intermediate.cpp
# Opt level: O2

bool __thiscall glslang::TIntermediate::promoteBinary(TIntermediate *this,TIntermBinary *node)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  TBasicType t;
  int mr;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  TQualifier *pTVar7;
  TIntermTyped *node_00;
  TIntermTyped *node_01;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  undefined4 extraout_var_25;
  undefined4 extraout_var_26;
  undefined4 extraout_var_27;
  undefined4 extraout_var_28;
  undefined4 extraout_var_29;
  undefined4 extraout_var_30;
  undefined4 extraout_var_31;
  undefined4 extraout_var_32;
  undefined4 extraout_var_33;
  undefined4 extraout_var_34;
  undefined4 extraout_var_35;
  undefined4 extraout_var_36;
  undefined4 extraout_var_37;
  undefined4 extraout_var_38;
  undefined4 extraout_var_39;
  undefined4 extraout_var_40;
  undefined4 extraout_var_41;
  _func_int **pp_Var8;
  TOperator TVar9;
  ulong uVar10;
  TType local_c8;
  
  TVar9 = (node->super_TIntermOperator).op;
  uVar10 = (ulong)TVar9;
  iVar3 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
            [0x32])(node);
  node_00 = (TIntermTyped *)CONCAT44(extraout_var,iVar3);
  iVar3 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
            [0x33])(node);
  node_01 = (TIntermTyped *)CONCAT44(extraout_var_00,iVar3);
  iVar3 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x2a])(node_00);
  if (((((char)iVar3 != '\0') ||
       (iVar3 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x2a])(node_01),
       (char)iVar3 != '\0')) ||
      (iVar3 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x20])(node_00), iVar3 == 0xf)) ||
     (iVar3 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x20])(node_01), iVar3 == 0xf)) {
    iVar3 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x1e])(node_00);
    iVar4 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x1e])(node_01);
    bVar2 = TType::operator!=((TType *)CONCAT44(extraout_var_01,iVar3),
                              (TType *)CONCAT44(extraout_var_02,iVar4));
    if (!bVar2) goto LAB_00405d5d;
    goto LAB_00405d47;
  }
LAB_00405d5d:
  iVar3 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x1e])(node_00);
  (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode[0x1d])
            (node,CONCAT44(extraout_var_03,iVar3));
  iVar3 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
            [0x1f])(node);
  pTVar7 = (TQualifier *)
           (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar3) + 0x50))
                     ((long *)CONCAT44(extraout_var_04,iVar3));
  TQualifier::clear(pTVar7);
  iVar3 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x2a])(node_00);
  if ((((char)iVar3 != '\0') ||
      (iVar3 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x20])(node_00), iVar3 == 0xf)) ||
     (iVar3 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x20])(node_00), iVar3 == 0xe)) {
    if (TVar9 - EOpEqual < 2) {
      iVar3 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x20])(node_00);
      if (iVar3 != 0xe) {
        TType::TType(&local_c8,EbtBool,EvqTemporary,1,0,0,false);
        (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode[0x1d]
        )(node,&local_c8);
        return true;
      }
    }
    else if (TVar9 == EOpAssign) {
      return true;
    }
    goto LAB_00405d47;
  }
  if (((this->source == EShSourceHlsl) &&
      ((iVar3 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x20])(node_00), iVar3 == 0xc ||
       (iVar3 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x20])(node_01), iVar3 == 0xc))))
     && ((TVar9 < EOpComma && ((0x787fe000000U >> ((ulong)TVar9 & 0x3f) & 1) != 0)))) {
    iVar3 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x20])(node_00);
    if (iVar3 == 0xc) {
      node_00 = createConversion(this,EbtInt,node_00);
    }
    iVar3 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x20])(node_01);
    if (iVar3 == 0xc) {
      node_01 = createConversion(this,EbtInt,node_01);
    }
    if (node_00 == (TIntermTyped *)0x0) {
      return false;
    }
    if (node_01 == (TIntermTyped *)0x0) {
      return false;
    }
    (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode[0x30])
              (node,node_00);
    (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode[0x31])
              (node,node_01);
    iVar3 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x1e])(node_00);
    (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode[0x1d])
              (node,CONCAT44(extraout_var_05,iVar3));
    iVar3 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
              [0x1f])(node);
    pTVar7 = (TQualifier *)
             (**(code **)(*(long *)CONCAT44(extraout_var_06,iVar3) + 0x50))
                       ((long *)CONCAT44(extraout_var_06,iVar3));
    TQualifier::clear(pTVar7);
  }
  switch(TVar9) {
  case EOpAdd:
  case EOpSub:
  case EOpMul:
  case EOpDiv:
switchD_00405f58_caseD_19:
    iVar3 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x20])(node_00);
    if ((iVar3 != 0xc) &&
       (iVar3 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x20])(node_01), iVar3 != 0xc))
    goto switchD_00405f58_caseD_25;
    break;
  case EOpMod:
  case EOpRightShift:
  case EOpLeftShift:
  case EOpAnd:
  case EOpInclusiveOr:
  case EOpExclusiveOr:
switchD_00405f58_caseD_1d:
    if ((this->source == EShSourceHlsl) ||
       (((((iVar3 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x20])(node_00),
           (iVar3 - 4U & 0xfffffff9) == 0 || ((iVar3 - 5U & 0xfffffff9) == 0)) ||
          (iVar3 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x20])(node_01),
          (iVar3 - 4U & 0xfffffff9) == 0)) || ((iVar3 - 5U & 0xfffffff9) == 0)) &&
        ((iVar3 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x29])(node_00),
         (char)iVar3 == '\0' &&
         (iVar3 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x29])(node_01),
         (char)iVar3 == '\0')))))) goto switchD_00405f58_caseD_25;
    break;
  case EOpEqual:
  case EOpNotEqual:
    if (this->source == EShSourceHlsl) {
      iVar4 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x26])(node_00);
      iVar3 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x26])();
      if (iVar3 < iVar4) {
        iVar3 = iVar4;
      }
      if (1 < iVar3) {
        TVar9 = (TVar9 != EOpEqual) + EOpVectorEqual;
        (node->super_TIntermOperator).op = TVar9;
        uVar10 = (ulong)TVar9;
      }
      TType::TType(&local_c8,EbtBool,EvqTemporary,iVar3,0,0,false);
      (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode[0x1d])
                (node,&local_c8);
    }
    else {
      iVar3 = 1;
LAB_0040614d:
      TType::TType(&local_c8,EbtBool,EvqTemporary,iVar3,0,0,false);
      (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode[0x1d])
                (node,&local_c8);
    }
  case EOpVectorEqual:
  case EOpVectorNotEqual:
  case EOpComma:
  case EOpVectorTimesScalar:
  case EOpVectorTimesMatrix:
  case EOpMatrixTimesVector:
  case EOpMatrixTimesScalar:
    goto switchD_00405f58_caseD_25;
  case EOpLessThan:
  case EOpGreaterThan:
  case EOpLessThanEqual:
  case EOpGreaterThanEqual:
    iVar3 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x20])(node_00);
    if (iVar3 != 0xc) {
LAB_00405f6f:
      iVar3 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x26])(node_00);
      goto LAB_0040614d;
    }
    break;
  case EOpLogicalOr:
  case EOpLogicalXor:
  case EOpLogicalAnd:
    iVar3 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x20])(node_00);
    if (((iVar3 == 0xc) &&
        (iVar3 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x29])(node_00),
        (char)iVar3 == '\0')) &&
       ((this->source != EShSourceGlsl ||
        (iVar3 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x2b])(node_00),
        (char)iVar3 == '\0')))) goto LAB_00405f6f;
    break;
  default:
    uVar5 = TVar9 - EOpAddAssign;
    if (uVar5 < 0xe) {
      if ((0x3f00U >> (uVar5 & 0x1f) & 1) != 0) goto switchD_00405f58_caseD_1d;
      if ((0x87U >> (uVar5 & 0x1f) & 1) != 0) goto switchD_00405f58_caseD_19;
    }
switchD_00405f58_caseD_25:
    uVar5 = (uint)uVar10;
    if (uVar5 < 0x33) {
      if ((0x707f800000000U >> (uVar10 & 0x3f) & 1) != 0) {
        iVar3 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x1e])(node_00);
        iVar4 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x1e])();
        bVar2 = TType::operator==((TType *)CONCAT44(extraout_var_07,iVar3),
                                  (TType *)CONCAT44(extraout_var_08,iVar4));
        return bVar2;
      }
      if ((0x736000000U >> (uVar10 & 0x3f) & 1) == 0) {
        if (uVar10 != 0x1b) goto LAB_004061d6;
      }
      else {
LAB_004061f8:
        iVar3 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x1e])(node_00);
        iVar4 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x1e])(node_01);
        bVar2 = TType::operator==((TType *)CONCAT44(extraout_var_09,iVar3),
                                  (TType *)CONCAT44(extraout_var_10,iVar4));
        if (bVar2) {
          return true;
        }
      }
LAB_0040622f:
      iVar3 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x20])(node_00);
      iVar4 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x20])();
      if (iVar3 != iVar4) break;
    }
    else {
LAB_004061d6:
      uVar6 = uVar5 - 0x1e0;
      if (uVar6 < 0xc) {
        if ((0xf83U >> (uVar6 & 0x1f) & 1) != 0) goto LAB_004061f8;
        if (uVar6 == 2) goto LAB_0040622f;
      }
    }
    iVar3 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x1e])(node_00);
    if (((*(byte *)(CONCAT44(extraout_var_11,iVar3) + 10) & 0x60) == 0) &&
       (iVar3 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x1e])(node_01),
       (*(byte *)(CONCAT44(extraout_var_12,iVar3) + 10) & 0x60) == 0)) {
      iVar3 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x1e])(node_00);
      if (((*(byte *)(CONCAT44(extraout_var_26,iVar3) + 0xb) & 8) != 0) ||
         (iVar3 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x1e])(node_01),
         (*(byte *)(CONCAT44(extraout_var_27,iVar3) + 0xb) & 8) != 0)) {
        iVar3 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x1e])(node_00);
        if (((*(byte *)(CONCAT44(extraout_var_28,iVar3) + 0xb) & 8) != 0) &&
           (iVar3 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x1e])(node_01),
           (*(byte *)(CONCAT44(extraout_var_29,iVar3) + 0xb) & 8) != 0)) {
          iVar3 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x1e])(node_00);
          iVar4 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x1e])(node_01);
          bVar2 = TType::operator!=((TType *)CONCAT44(extraout_var_30,iVar3),
                                    (TType *)CONCAT44(extraout_var_31,iVar4));
          if (bVar2) break;
        }
        if (uVar5 < 0x20) {
          if ((0xd6000000U >> (uVar5 & 0x1f) & 1) != 0) goto LAB_0040665e;
          if (uVar5 != 0x1b) goto LAB_004065dd;
        }
        else {
LAB_004065dd:
          if ((uVar5 - 0x1ec < 2) || (uVar5 == 0x1df)) {
LAB_0040665e:
            iVar3 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x1e])(node_00);
            if ((*(byte *)(CONCAT44(extraout_var_35,iVar3) + 0xb) & 8) != 0) {
              iVar3 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x1e])(node_01);
              return (bool)((*(byte *)(CONCAT44(extraout_var_36,iVar3) + 0xb) & 8) >> 3);
            }
            break;
          }
          if (uVar5 != 0x1e2) break;
        }
        iVar3 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x1e])(node_00);
        if (((*(byte *)(CONCAT44(extraout_var_32,iVar3) + 0xb) & 8) == 0) ||
           (iVar3 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x1e])(node_01),
           (*(byte *)(CONCAT44(extraout_var_33,iVar3) + 0xb) & 8) == 0)) {
          TVar9 = EOpVectorTimesScalar;
          if (uVar5 == 0x1e2) {
            TVar9 = EOpVectorTimesScalarAssign;
          }
          (node->super_TIntermOperator).op = TVar9;
        }
        iVar3 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x1e])(node_01);
        bVar1 = *(byte *)(CONCAT44(extraout_var_34,iVar3) + 0xb) & 8;
joined_r0x004063ae:
        if (bVar1 == 0) {
          return true;
        }
        iVar3 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x1e])();
        (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode[0x1d]
        )(node,CONCAT44(extraout_var_23,iVar3));
        return true;
      }
      iVar3 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x2c])(node_00);
      if (((char)iVar3 != '\0') &&
         (iVar3 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x2c])(), (char)iVar3 != '\0')) {
        return true;
      }
      iVar3 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x2b])(node_00);
      if (((char)iVar3 != '\0') &&
         (iVar3 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x2b])(), (char)iVar3 != '\0')) {
        iVar3 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x26])(node_00);
        iVar4 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x26])();
        if ((iVar3 != iVar4) &&
           (iVar3 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x26])(), 1 < iVar3)) break;
      }
      t = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x20])(node_00);
      bVar2 = false;
      uVar6 = uVar5 - 0x1df;
      switch(uVar6) {
      case 0:
        iVar3 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x26])(node_00);
        iVar4 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x26])();
        if (iVar3 == iVar4) {
          iVar3 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x27])(node_00);
          iVar4 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x27])();
          if (iVar3 == iVar4) {
            iVar3 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x28])(node_00);
            iVar4 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x28])();
            if (iVar3 == iVar4) goto switchD_004064f6_caseD_1;
          }
        }
        break;
      case 1:
      case 2:
      case 8:
      case 9:
      case 10:
      case 0xb:
      case 0xc:
switchD_004064f6_caseD_1:
        iVar3 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x29])(node_00);
        if ((((char)iVar3 == '\0') ||
            (iVar3 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x2b])(), (char)iVar3 == '\0')
            ) && ((iVar3 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x2b])(node_00),
                  (char)iVar3 == '\0' ||
                  (iVar3 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x29])(),
                  (char)iVar3 == '\0')))) {
          iVar3 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x20])(node_00);
          iVar4 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x20])();
          if (iVar3 == iVar4) {
            iVar3 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x29])(node_00);
            if (((char)iVar3 == '\0') ||
               (iVar3 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x29])(),
               (char)iVar3 == '\0')) {
LAB_0040677f:
              iVar3 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x2b])(node_00);
              if (((char)iVar3 != '\0') &&
                 (iVar3 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x2b])(),
                 (char)iVar3 != '\0')) {
                iVar3 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x26])(node_00);
                iVar4 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x26])();
                if (iVar3 != iVar4) break;
              }
              iVar3 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x2b])();
              if (((char)iVar3 != '\0') ||
                 (iVar3 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x29])(),
                 (char)iVar3 != '\0')) {
                iVar3 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                          _vptr_TIntermNode[0x1f])(node);
                iVar4 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x1e])();
                TType::shallowCopy((TType *)CONCAT44(extraout_var_37,iVar3),
                                   (TType *)CONCAT44(extraout_var_38,iVar4));
                iVar3 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                          _vptr_TIntermNode[0x1f])(node);
                pTVar7 = (TQualifier *)
                         (**(code **)(*(long *)CONCAT44(extraout_var_39,iVar3) + 0x50))
                                   ((long *)CONCAT44(extraout_var_39,iVar3));
                TQualifier::makeTemporary(pTVar7);
              }
              goto LAB_0040688d;
            }
            iVar3 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x27])(node_00);
            iVar4 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x27])();
            if (iVar3 == iVar4) {
              iVar3 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x28])(node_00);
              iVar4 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x28])();
              if (iVar3 == iVar4) goto LAB_0040677f;
            }
          }
        }
        break;
      case 3:
        iVar3 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x29])(node_00);
        if (((char)iVar3 == '\0') &&
           (iVar3 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x29])(), (char)iVar3 != '\0'))
        {
          iVar3 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x2b])(node_00);
          if ((char)iVar3 != '\0') {
            iVar3 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x26])(node_00);
            iVar4 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x28])();
            if (iVar3 == iVar4) {
              iVar3 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x26])(node_00);
              iVar4 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x27])();
              if (iVar3 == iVar4) {
                (node->super_TIntermOperator).op = EOpVectorTimesMatrixAssign;
                goto LAB_004068d1;
              }
            }
          }
        }
        else {
          iVar3 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x29])(node_00);
          if (((char)iVar3 != '\0') &&
             (iVar3 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x29])(), (char)iVar3 == '\0'
             )) {
            iVar3 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x2b])();
            if ((char)iVar3 == '\0') {
              (node->super_TIntermOperator).op = EOpMatrixTimesScalarAssign;
              goto LAB_004068d1;
            }
            break;
          }
          iVar3 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x29])(node_00);
          if (((char)iVar3 != '\0') &&
             (iVar3 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x29])(), (char)iVar3 != '\0'
             )) {
            iVar3 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x27])(node_00);
            iVar4 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x27])();
            if (iVar3 == iVar4) {
              iVar3 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x27])(node_00);
              iVar4 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x28])();
              if (iVar3 == iVar4) {
                (node->super_TIntermOperator).op = EOpMatrixTimesMatrixAssign;
                goto LAB_004068d1;
              }
            }
            break;
          }
          iVar3 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x29])(node_00);
          if (((char)iVar3 != '\0') ||
             (iVar3 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x29])(), (char)iVar3 != '\0'
             )) break;
          iVar3 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x2b])(node_00);
          if ((((char)iVar3 == '\0') ||
              (iVar3 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x2b])(),
              (char)iVar3 == '\0')) &&
             ((iVar3 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x2b])(node_00),
              (char)iVar3 != '\0' ||
              (iVar3 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x2b])(),
              (char)iVar3 != '\0')))) {
            iVar3 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x2b])(node_00);
            if ((char)iVar3 != '\0') {
              (node->super_TIntermOperator).op = EOpVectorTimesScalarAssign;
              goto LAB_004068d1;
            }
            break;
          }
LAB_004068a3:
          iVar3 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                    _vptr_TIntermNode[0x1e])(node);
          iVar4 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x1e])(node_00);
          bVar2 = TType::operator!=((TType *)CONCAT44(extraout_var_40,iVar3),
                                    (TType *)CONCAT44(extraout_var_41,iVar4));
          if (!bVar2) goto LAB_004068d1;
        }
        break;
      case 4:
      case 5:
      case 6:
      case 7:
        goto switchD_004064f6_caseD_4;
      case 0xd:
      case 0xe:
switchD_004064f6_caseD_d:
        iVar3 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x2b])();
        if ((char)iVar3 == '\0') {
LAB_0040688d:
          if ((uVar6 < 0xf) && ((0x7f0fU >> (uVar6 & 0x1f) & 1) != 0)) goto LAB_004068a3;
          goto LAB_004068d1;
        }
        iVar3 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x2b])(node_00);
        if ((char)iVar3 != '\0') {
          iVar3 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x26])();
          iVar4 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x26])(node_00);
          if (iVar3 == iVar4) goto LAB_0040688d;
        }
        break;
      default:
        if (0x22 < uVar5) {
          return false;
        }
        if ((0x736000000U >> (uVar10 & 0x3f) & 1) != 0) goto switchD_004064f6_caseD_1;
        if ((0xc0000000UL >> (uVar10 & 0x3f) & 1) != 0) goto switchD_004064f6_caseD_d;
        if (uVar10 != 0x1b) {
          return false;
        }
        iVar3 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x29])(node_00);
        if (((char)iVar3 != '\0') ||
           (iVar3 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x29])(), (char)iVar3 == '\0'))
        {
          iVar3 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x29])(node_00);
          if (((char)iVar3 == '\0') ||
             (iVar3 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x29])(), (char)iVar3 != '\0'
             )) {
            iVar3 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x29])(node_00);
            if (((char)iVar3 == '\0') ||
               (iVar3 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x29])(),
               (char)iVar3 == '\0')) {
              iVar3 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x29])(node_00);
              if (((char)iVar3 == '\0') &&
                 (iVar3 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x29])(),
                 (char)iVar3 == '\0')) {
                iVar3 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x2b])(node_00);
                if ((((char)iVar3 == '\0') ||
                    (iVar3 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x2b])(),
                    (char)iVar3 == '\0')) &&
                   ((iVar3 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x2b])(node_00),
                    (char)iVar3 != '\0' ||
                    (iVar3 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x2b])(),
                    (char)iVar3 != '\0')))) {
                  (node->super_TIntermOperator).op = EOpVectorTimesScalar;
                  iVar3 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x2b])();
                  if ((char)iVar3 != '\0') {
                    iVar3 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x26])();
                    goto LAB_00406cd5;
                  }
                }
                goto LAB_004068d1;
              }
            }
            else {
              iVar3 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x27])(node_00);
              iVar4 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x28])();
              if (iVar3 == iVar4) {
                (node->super_TIntermOperator).op = EOpMatrixTimesMatrix;
                pp_Var8 = (node_01->super_TIntermNode)._vptr_TIntermNode;
                goto LAB_00406d05;
              }
            }
          }
          else {
            iVar3 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x2b])();
            if ((char)iVar3 == '\0') {
              (node->super_TIntermOperator).op = EOpMatrixTimesScalar;
              goto LAB_004068d1;
            }
            iVar3 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x27])(node_00);
            iVar4 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x26])();
            if (iVar3 == iVar4) {
              (node->super_TIntermOperator).op = EOpMatrixTimesVector;
              iVar3 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x28])(node_00);
              goto LAB_00406cd5;
            }
          }
          break;
        }
        iVar3 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x2b])(node_00);
        if ((char)iVar3 == '\0') {
          (node->super_TIntermOperator).op = EOpMatrixTimesScalar;
          pp_Var8 = (node_01->super_TIntermNode)._vptr_TIntermNode;
          node_00 = node_01;
LAB_00406d05:
          iVar4 = (*pp_Var8[0x27])(node_01);
          mr = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x28])(node_00);
          iVar3 = 0;
        }
        else {
          iVar3 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x26])(node_00);
          iVar4 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x28])();
          if (iVar3 != iVar4) break;
          (node->super_TIntermOperator).op = EOpVectorTimesMatrix;
          iVar3 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x27])();
LAB_00406cd5:
          iVar4 = 0;
          mr = 0;
        }
        TType::TType(&local_c8,t,EvqTemporary,iVar3,iVar4,mr,false);
        (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode[0x1d]
        )(node,&local_c8);
LAB_004068d1:
        bVar2 = true;
        goto switchD_004064f6_caseD_4;
      }
    }
    else {
      iVar3 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x1e])(node_00);
      if (((*(byte *)(CONCAT44(extraout_var_13,iVar3) + 10) & 0x60) != 0) &&
         (iVar3 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x1e])(node_01),
         (*(byte *)(CONCAT44(extraout_var_14,iVar3) + 10) & 0x60) != 0)) {
        iVar3 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x1e])(node_00);
        iVar4 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x1e])(node_01);
        bVar2 = TType::operator!=((TType *)CONCAT44(extraout_var_15,iVar3),
                                  (TType *)CONCAT44(extraout_var_16,iVar4));
        if (bVar2) break;
      }
      if (uVar5 - 0x19 < 2) {
LAB_004063d1:
        iVar3 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x1e])(node_00);
        if ((*(byte *)(CONCAT44(extraout_var_24,iVar3) + 10) & 0x60) != 0) {
          iVar3 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x1e])(node_01);
          return (*(byte *)(CONCAT44(extraout_var_25,iVar3) + 10) & 0x60) != 0;
        }
      }
      else {
        if (uVar5 != 0x1e2) {
          if ((uVar5 == 0x1c) || (uVar5 == 0x1df)) goto LAB_004063d1;
          if (uVar5 != 0x1b) break;
        }
        iVar3 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x1e])(node_00);
        if ((((*(byte *)(CONCAT44(extraout_var_17,iVar3) + 10) & 0x20) == 0) ||
            (iVar3 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x1e])(node_01),
            (*(byte *)(CONCAT44(extraout_var_18,iVar3) + 10) & 0x20) == 0)) &&
           ((uVar5 != 0x1e2 ||
            (iVar3 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x1e])(node_01),
            (*(byte *)(CONCAT44(extraout_var_19,iVar3) + 10) & 0x20) == 0)))) {
          iVar3 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x1e])(node_00);
          if (((*(byte *)(CONCAT44(extraout_var_20,iVar3) + 10) & 0x60) == 0) ||
             (iVar3 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x1e])(node_01),
             (*(byte *)(CONCAT44(extraout_var_21,iVar3) + 10) & 0x60) == 0)) {
            TVar9 = EOpMatrixTimesScalar;
            if (uVar5 == 0x1e2) {
              TVar9 = EOpMatrixTimesScalarAssign;
            }
            (node->super_TIntermOperator).op = TVar9;
          }
          iVar3 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x1e])(node_01);
          bVar1 = *(byte *)(CONCAT44(extraout_var_22,iVar3) + 10) & 0x60;
          goto joined_r0x004063ae;
        }
      }
    }
  }
LAB_00405d47:
  bVar2 = false;
switchD_004064f6_caseD_4:
  return bVar2;
}

Assistant:

bool TIntermediate::promoteBinary(TIntermBinary& node)
{
    TOperator     op    = node.getOp();
    TIntermTyped* left  = node.getLeft();
    TIntermTyped* right = node.getRight();

    // Arrays and structures have to be exact matches.
    if ((left->isArray() || right->isArray() || left->getBasicType() == EbtStruct || right->getBasicType() == EbtStruct)
        && left->getType() != right->getType())
        return false;

    // Base assumption:  just make the type the same as the left
    // operand.  Only deviations from this will be coded.
    node.setType(left->getType());
    node.getWritableType().getQualifier().clear();

    // Composite and opaque types don't having pending operator changes, e.g.,
    // array, structure, and samplers.  Just establish final type and correctness.
    if (left->isArray() || left->getBasicType() == EbtStruct || left->getBasicType() == EbtSampler) {
        switch (op) {
        case EOpEqual:
        case EOpNotEqual:
            if (left->getBasicType() == EbtSampler) {
                // can't compare samplers
                return false;
            } else {
                // Promote to conditional
                node.setType(TType(EbtBool));
            }

            return true;

        case EOpAssign:
            // Keep type from above

            return true;

        default:
            return false;
        }
    }

    //
    // We now have only scalars, vectors, and matrices to worry about.
    //

    // HLSL implicitly promotes bool -> int for numeric operations.
    // (Implicit conversions to make the operands match each other's types were already done.)
    if (getSource() == EShSourceHlsl &&
        (left->getBasicType() == EbtBool || right->getBasicType() == EbtBool)) {
        switch (op) {
        case EOpLessThan:
        case EOpGreaterThan:
        case EOpLessThanEqual:
        case EOpGreaterThanEqual:

        case EOpRightShift:
        case EOpLeftShift:

        case EOpMod:

        case EOpAnd:
        case EOpInclusiveOr:
        case EOpExclusiveOr:

        case EOpAdd:
        case EOpSub:
        case EOpDiv:
        case EOpMul:
            if (left->getBasicType() == EbtBool)
                left  = createConversion(EbtInt, left);
            if (right->getBasicType() == EbtBool)
                right = createConversion(EbtInt, right);
            if (left == nullptr || right == nullptr)
                return false;
            node.setLeft(left);
            node.setRight(right);

            // Update the original base assumption on result type..
            node.setType(left->getType());
            node.getWritableType().getQualifier().clear();

            break;

        default:
            break;
        }
    }

    // Do general type checks against individual operands (comparing left and right is coming up, checking mixed shapes after that)
    switch (op) {
    case EOpLessThan:
    case EOpGreaterThan:
    case EOpLessThanEqual:
    case EOpGreaterThanEqual:
        // Relational comparisons need numeric types and will promote to scalar Boolean.
        if (left->getBasicType() == EbtBool)
            return false;

        node.setType(TType(EbtBool, EvqTemporary, left->getVectorSize()));
        break;

    case EOpEqual:
    case EOpNotEqual:
        if (getSource() == EShSourceHlsl) {
            const int resultWidth = std::max(left->getVectorSize(), right->getVectorSize());

            // In HLSL, == or != on vectors means component-wise comparison.
            if (resultWidth > 1) {
                op = (op == EOpEqual) ? EOpVectorEqual : EOpVectorNotEqual;
                node.setOp(op);
            }

            node.setType(TType(EbtBool, EvqTemporary, resultWidth));
        } else {
            // All the above comparisons result in a bool (but not the vector compares)
            node.setType(TType(EbtBool));
        }
        break;

    case EOpLogicalAnd:
    case EOpLogicalOr:
    case EOpLogicalXor:
        // logical ops operate only on Booleans or vectors of Booleans.
        if (left->getBasicType() != EbtBool || left->isMatrix())
                return false;

        if (getSource() == EShSourceGlsl) {
            // logical ops operate only on scalar Booleans and will promote to scalar Boolean.
            if (left->isVector())
                return false;
        }

        node.setType(TType(EbtBool, EvqTemporary, left->getVectorSize()));
        break;

    case EOpRightShift:
    case EOpLeftShift:
    case EOpRightShiftAssign:
    case EOpLeftShiftAssign:

    case EOpMod:
    case EOpModAssign:

    case EOpAnd:
    case EOpInclusiveOr:
    case EOpExclusiveOr:
    case EOpAndAssign:
    case EOpInclusiveOrAssign:
    case EOpExclusiveOrAssign:
        if (getSource() == EShSourceHlsl)
            break;

        // Check for integer-only operands.
        if (!isTypeInt(left->getBasicType()) && !isTypeInt(right->getBasicType()))
            return false;
        if (left->isMatrix() || right->isMatrix())
            return false;

        break;

    case EOpAdd:
    case EOpSub:
    case EOpDiv:
    case EOpMul:
    case EOpAddAssign:
    case EOpSubAssign:
    case EOpMulAssign:
    case EOpDivAssign:
        // check for non-Boolean operands
        if (left->getBasicType() == EbtBool || right->getBasicType() == EbtBool)
            return false;
        break;

    default:
        break;
    }

    // Compare left and right, and finish with the cases where the operand types must match
    switch (op) {
    case EOpLessThan:
    case EOpGreaterThan:
    case EOpLessThanEqual:
    case EOpGreaterThanEqual:

    case EOpEqual:
    case EOpNotEqual:
    case EOpVectorEqual:
    case EOpVectorNotEqual:

    case EOpLogicalAnd:
    case EOpLogicalOr:
    case EOpLogicalXor:
        return left->getType() == right->getType();

    case EOpMod:
    case EOpModAssign:

    case EOpAnd:
    case EOpInclusiveOr:
    case EOpExclusiveOr:
    case EOpAndAssign:
    case EOpInclusiveOrAssign:
    case EOpExclusiveOrAssign:

    case EOpAdd:
    case EOpSub:
    case EOpDiv:

    case EOpAddAssign:
    case EOpSubAssign:
    case EOpDivAssign:
        // Quick out in case the types do match
        if (left->getType() == right->getType())
            return true;

        [[fallthrough]];

    case EOpMul:
    case EOpMulAssign:
        // At least the basic type has to match
        if (left->getBasicType() != right->getBasicType())
            return false;
        break;

    default:
        break;
    }

    if (left->getType().isCoopMat() || right->getType().isCoopMat()) {
        // Operations on two cooperative matrices must have identical types
        if (left->getType().isCoopMat() && right->getType().isCoopMat() &&
            left->getType() != right->getType()) {
            return false;
        }
        switch (op) {
        case EOpMul:
        case EOpMulAssign:
            // Mul not supported in NV_cooperative_matrix
            if (left->getType().isCoopMatNV() && right->getType().isCoopMatNV()) {
                return false;
            }
            // NV_cooperative_matrix supports MulAssign is for mat*=scalar only.
            // KHR_cooperative_matrix supports it for mat*=mat as well.
            if (op == EOpMulAssign && right->getType().isCoopMatNV()) {
                return false;
            }
            // Use MatrixTimesScalar if either operand is not a matrix. Otherwise use Mul.
            if (!left->getType().isCoopMat() || !right->getType().isCoopMat()) {
                node.setOp(op == EOpMulAssign ? EOpMatrixTimesScalarAssign : EOpMatrixTimesScalar);
            }
            // In case of scalar*matrix, take the result type from the matrix.
            if (right->getType().isCoopMat()) {
                node.setType(right->getType());
            }
            return true;
        case EOpAdd:
        case EOpSub:
        case EOpDiv:
        case EOpAssign:
            // These require both to be cooperative matrices
            if (!left->getType().isCoopMat() || !right->getType().isCoopMat()) {
                return false;
            }
            return true;
        default:
            break;
        }
        return false;
    }

    if (left->getType().isCoopVecNV() || right->getType().isCoopVecNV()) {
        // Operations on two cooperative vectors must have identical types
        if (left->getType().isCoopVecNV() && right->getType().isCoopVecNV() &&
            left->getType() != right->getType()) {
            return false;
        }
        switch (op) {
        case EOpMul:
        case EOpMulAssign:
            // Use VectorTimesScalar if either operand is not a vector. Otherwise use Mul.
            if (!left->getType().isCoopVecNV() || !right->getType().isCoopVecNV()) {
                node.setOp(op == EOpMulAssign ? EOpVectorTimesScalarAssign : EOpVectorTimesScalar);
            }
            // In case of scalar*vector, take the result type from the vector.
            if (right->getType().isCoopVecNV()) {
                node.setType(right->getType());
            }
            return true;
        case EOpLeftShift:
        case EOpLeftShiftAssign:
        case EOpRightShift:
        case EOpRightShiftAssign:
        case EOpAdd:
        case EOpSub:
        case EOpDiv:
        case EOpAssign:
            // These require both to be cooperative vectors
            if (!left->getType().isCoopVecNV() || !right->getType().isCoopVecNV()) {
                return false;
            }
            return true;
        default:
            break;
        }
        return false;
    }

    // Finish handling the case, for all ops, where both operands are scalars.
    if (left->isScalar() && right->isScalar())
        return true;

    // Finish handling the case, for all ops, where there are two vectors of different sizes
    if (left->isVector() && right->isVector() && left->getVectorSize() != right->getVectorSize() && right->getVectorSize() > 1)
        return false;

    //
    // We now have a mix of scalars, vectors, or matrices, for non-relational operations.
    //

    // Can these two operands be combined, what is the resulting type?
    TBasicType basicType = left->getBasicType();
    switch (op) {
    case EOpMul:
        if (!left->isMatrix() && right->isMatrix()) {
            if (left->isVector()) {
                if (left->getVectorSize() != right->getMatrixRows())
                    return false;
                node.setOp(op = EOpVectorTimesMatrix);
                node.setType(TType(basicType, EvqTemporary, right->getMatrixCols()));
            } else {
                node.setOp(op = EOpMatrixTimesScalar);
                node.setType(TType(basicType, EvqTemporary, 0, right->getMatrixCols(), right->getMatrixRows()));
            }
        } else if (left->isMatrix() && !right->isMatrix()) {
            if (right->isVector()) {
                if (left->getMatrixCols() != right->getVectorSize())
                    return false;
                node.setOp(op = EOpMatrixTimesVector);
                node.setType(TType(basicType, EvqTemporary, left->getMatrixRows()));
            } else {
                node.setOp(op = EOpMatrixTimesScalar);
            }
        } else if (left->isMatrix() && right->isMatrix()) {
            if (left->getMatrixCols() != right->getMatrixRows())
                return false;
            node.setOp(op = EOpMatrixTimesMatrix);
            node.setType(TType(basicType, EvqTemporary, 0, right->getMatrixCols(), left->getMatrixRows()));
        } else if (! left->isMatrix() && ! right->isMatrix()) {
            if (left->isVector() && right->isVector()) {
                ; // leave as component product
            } else if (left->isVector() || right->isVector()) {
                node.setOp(op = EOpVectorTimesScalar);
                if (right->isVector())
                    node.setType(TType(basicType, EvqTemporary, right->getVectorSize()));
            }
        } else {
            return false;
        }
        break;
    case EOpMulAssign:
        if (! left->isMatrix() && right->isMatrix()) {
            if (left->isVector()) {
                if (left->getVectorSize() != right->getMatrixRows() || left->getVectorSize() != right->getMatrixCols())
                    return false;
                node.setOp(op = EOpVectorTimesMatrixAssign);
            } else {
                return false;
            }
        } else if (left->isMatrix() && !right->isMatrix()) {
            if (right->isVector()) {
                return false;
            } else {
                node.setOp(op = EOpMatrixTimesScalarAssign);
            }
        } else if (left->isMatrix() && right->isMatrix()) {
            if (left->getMatrixCols() != right->getMatrixCols() || left->getMatrixCols() != right->getMatrixRows())
                return false;
            node.setOp(op = EOpMatrixTimesMatrixAssign);
        } else if (!left->isMatrix() && !right->isMatrix()) {
            if (left->isVector() && right->isVector()) {
                // leave as component product
            } else if (left->isVector() || right->isVector()) {
                if (! left->isVector())
                    return false;
                node.setOp(op = EOpVectorTimesScalarAssign);
            }
        } else {
            return false;
        }
        break;

    case EOpRightShift:
    case EOpLeftShift:
    case EOpRightShiftAssign:
    case EOpLeftShiftAssign:
        if (right->isVector() && (! left->isVector() || right->getVectorSize() != left->getVectorSize()))
            return false;
        break;

    case EOpAssign:
        if (left->getVectorSize() != right->getVectorSize() || left->getMatrixCols() != right->getMatrixCols() || left->getMatrixRows() != right->getMatrixRows())
            return false;
        [[fallthrough]];

    case EOpAdd:
    case EOpSub:
    case EOpDiv:
    case EOpMod:
    case EOpAnd:
    case EOpInclusiveOr:
    case EOpExclusiveOr:
    case EOpAddAssign:
    case EOpSubAssign:
    case EOpDivAssign:
    case EOpModAssign:
    case EOpAndAssign:
    case EOpInclusiveOrAssign:
    case EOpExclusiveOrAssign:

        if ((left->isMatrix() && right->isVector()) ||
            (left->isVector() && right->isMatrix()) ||
            left->getBasicType() != right->getBasicType())
            return false;
        if (left->isMatrix() && right->isMatrix() && (left->getMatrixCols() != right->getMatrixCols() || left->getMatrixRows() != right->getMatrixRows()))
            return false;
        if (left->isVector() && right->isVector() && left->getVectorSize() != right->getVectorSize())
            return false;
        if (right->isVector() || right->isMatrix()) {
            node.getWritableType().shallowCopy(right->getType());
            node.getWritableType().getQualifier().makeTemporary();
        }
        break;

    default:
        return false;
    }

    //
    // One more check for assignment.
    //
    switch (op) {
    // The resulting type has to match the left operand.
    case EOpAssign:
    case EOpAddAssign:
    case EOpSubAssign:
    case EOpMulAssign:
    case EOpDivAssign:
    case EOpModAssign:
    case EOpAndAssign:
    case EOpInclusiveOrAssign:
    case EOpExclusiveOrAssign:
    case EOpLeftShiftAssign:
    case EOpRightShiftAssign:
        if (node.getType() != left->getType())
            return false;
        break;
    default:
        break;
    }

    return true;
}